

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O3

optional<bool> __thiscall
unodb::detail::olc_impl_helpers::
remove_or_choose_subtree<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_inode_4<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
          (olc_impl_helpers *this,
          olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          *inode,byte key_byte,basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> k,
          olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          *db_instance,read_critical_section *parent_critical_section,
          read_critical_section *node_critical_section,
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
          *node_in_parent,
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
          **child_in_parent,read_critical_section *child_critical_section,node_type *child_type,
          olc_node_ptr *child)

{
  long *plVar1;
  atomic<long> *paVar2;
  long lVar3;
  undefined8 uVar4;
  long *plVar5;
  long lVar6;
  __int_type_conflict _Var7;
  __int_type_conflict _Var8;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *piVar9;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *piVar10;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *piVar11;
  uint uVar12;
  write_guard wVar13;
  write_guard wVar14;
  bool bVar15;
  ushort uVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  pthread_t pVar20;
  basic_node_ptr<unodb::detail::olc_node_header> bVar21;
  ulong uVar22;
  undefined7 in_register_00000011;
  uintptr_t uVar23;
  db_type *db_instance_00;
  ushort uVar24;
  ulong __n;
  optimistic_lock *poVar25;
  undefined1 auVar26 [16];
  __atomic_base<unsigned_long> local_78;
  write_guard node_guard;
  uint8_t local_60;
  write_guard local_50;
  write_guard child_guard_1;
  write_guard local_40;
  write_guard node_guard_1;
  write_guard child_guard;
  
  db_instance_00 = k.field_0._8_8_;
  uVar22 = k.field_0._0_8_;
  auVar26[0] = SUB81(inode,0);
  auVar26[1] = auVar26[0];
  auVar26[2] = auVar26[0];
  auVar26[3] = auVar26[0];
  auVar26[4] = auVar26[0];
  auVar26[5] = auVar26[0];
  auVar26[6] = auVar26[0];
  auVar26[7] = auVar26[0];
  auVar26[8] = auVar26[0];
  auVar26[9] = auVar26[0];
  auVar26[10] = auVar26[0];
  auVar26[0xb] = auVar26[0];
  auVar26[0xc] = auVar26[0];
  auVar26[0xd] = auVar26[0];
  auVar26[0xe] = auVar26[0];
  auVar26[0xf] = auVar26[0];
  auVar26 = vpcmpeqb_avx(auVar26,ZEXT416(*(uint *)(this + 0x24)));
  uVar17 = (uint)(ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar26[0xf] >> 7) << 0xf) &
           ~(-1 << ((byte)this[0x20] & 0x1f));
  if (uVar17 == 0) {
    plVar5 = (long *)(db_instance->root_pointer_lock).version.version.
                     super___atomic_base<unsigned_long>._M_i;
    lVar6 = (db_instance->root_pointer_lock).read_lock_count.super___atomic_base<long>._M_i;
    if (plVar5[1] < 1) {
LAB_001d7b44:
      __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                    ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
    }
    LOCK();
    plVar1 = plVar5 + 1;
    lVar3 = *plVar1;
    *plVar1 = *plVar1 + -1;
    UNLOCK();
    if (lVar6 == *plVar5) {
      if (lVar3 < 1) goto LAB_001d7b63;
      (db_instance->root_pointer_lock).version.version.super___atomic_base<unsigned_long>._M_i = 0;
      poVar25 = parent_critical_section->lock;
      _Var7 = (parent_critical_section->version).version;
      if ((poVar25->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_001d7b44;
      _Var8 = (poVar25->version).version.super___atomic_base<unsigned_long>._M_i;
      LOCK();
      paVar2 = &poVar25->read_lock_count;
      uVar23 = (paVar2->super___atomic_base<long>)._M_i;
      (paVar2->super___atomic_base<long>)._M_i = (paVar2->super___atomic_base<long>)._M_i + -1;
      UNLOCK();
      child_in_parent =
           (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> **)
           parent_critical_section;
      if (_Var7 == _Var8) {
LAB_001d797b:
        if ((long)uVar23 < 1) goto LAB_001d7b63;
        ((read_critical_section *)child_in_parent)->lock = (optimistic_lock *)0x0;
        uVar24 = 0x100;
        uVar16 = 0;
        goto LAB_001d7992;
      }
      if ((long)uVar23 < 1) goto LAB_001d7b63;
      parent_critical_section->lock = (optimistic_lock *)0x0;
    }
    else {
      if (lVar3 < 1) goto LAB_001d7b63;
      (db_instance->root_pointer_lock).version.version.super___atomic_base<unsigned_long>._M_i = 0;
    }
  }
  else {
    uVar12 = 0;
    if (uVar17 != 0) {
      for (; (uVar17 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
      }
    }
    *(undefined8 *)child_type = *(undefined8 *)(this + (ulong)uVar12 * 8 + 0x28);
    child_guard_1.lock = &db_instance->root_pointer_lock;
    bVar15 = optimistic_lock::check
                       (parent_critical_section->lock,
                        (version_type)(parent_critical_section->version).version);
    if (bVar15) {
      optimistic_lock::try_read_lock((optimistic_lock *)&stack0xffffffffffffff88);
      *child_in_parent =
           (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)
           local_78._M_i;
      local_78._M_i = 0;
      child_in_parent[1] =
           (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)
           node_guard.lock;
      optimistic_lock::read_critical_section::~read_critical_section
                ((read_critical_section *)&stack0xffffffffffffff88);
      if (*child_in_parent !=
          (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)0x0
         ) {
        uVar4 = *(undefined8 *)child_type;
        *(byte *)&child_critical_section->lock = (byte)uVar4 & 7;
        if ((uVar4 & (I256|I48)) == LEAF) {
          uVar19 = (ulong)*(uint *)((uVar4 & 0xfffffffffffffff8) + 0x18);
          __n = uVar22;
          if (uVar19 < uVar22) {
            __n = uVar19;
          }
          iVar18 = bcmp((void *)CONCAT71(in_register_00000011,key_byte),
                        (void *)((uVar4 & 0xfffffffffffffff8) + 0x20),__n);
          wVar14 = child_guard_1;
          if (iVar18 == 0 && uVar19 == uVar22) {
            if (this[0x20] == (olc_impl_helpers)0x2) {
              bVar15 = optimistic_lock::try_upgrade_to_write_lock
                                 ((optimistic_lock *)
                                  ((child_guard_1.lock)->version).version.
                                  super___atomic_base<unsigned_long>._M_i,
                                  (version_type)
                                  ((child_guard_1.lock)->read_lock_count).super___atomic_base<long>.
                                  _M_i);
              node_guard_1.lock = (optimistic_lock *)0x0;
              if (bVar15) {
                node_guard_1.lock =
                     (optimistic_lock *)
                     ((wVar14.lock)->version).version.super___atomic_base<unsigned_long>._M_i;
              }
              ((wVar14.lock)->version).version.super___atomic_base<unsigned_long>._M_i = 0;
              if (node_guard_1.lock != (optimistic_lock *)0x0) {
                bVar15 = optimistic_lock::try_upgrade_to_write_lock
                                   (parent_critical_section->lock,
                                    (version_type)(parent_critical_section->version).version);
                local_40.lock = (optimistic_lock *)0x0;
                if (bVar15) {
                  local_40.lock = parent_critical_section->lock;
                }
                parent_critical_section->lock = (optimistic_lock *)0x0;
                if (local_40.lock != (optimistic_lock *)0x0) {
                  bVar15 = optimistic_lock::try_upgrade_to_write_lock
                                     ((optimistic_lock *)*child_in_parent,
                                      (version_type)child_in_parent[1]);
                  wVar14.lock = local_40.lock;
                  local_50.lock = (optimistic_lock *)0x0;
                  if (bVar15) {
                    local_50.lock = (optimistic_lock *)*child_in_parent;
                  }
                  *child_in_parent =
                       (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                        *)0x0;
                  if (local_50.lock != (optimistic_lock *)0x0) {
                    local_78._M_i = (__int_type_conflict)db_instance_00;
                    node_guard.lock = (optimistic_lock *)this;
                    optimistic_lock::atomic_version_type::write_unlock_and_obsolete
                              (&(local_40.lock)->version);
                    pVar20 = pthread_self();
                    wVar13.lock = local_50.lock;
                    ((wVar14.lock)->obsoleter_thread)._M_thread = pVar20;
                    local_40.lock = (optimistic_lock *)0x0;
                    optimistic_lock::atomic_version_type::write_unlock_and_obsolete
                              (&(local_50.lock)->version);
                    ((wVar13.lock)->obsoleter_thread)._M_thread = pVar20;
                    local_50.lock = (optimistic_lock *)0x0;
                    local_60 = (uint8_t)uVar12;
                    bVar21 = olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                             ::leave_last_child((olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                                                 *)this,local_60,db_instance_00);
                    node_critical_section->lock = (optimistic_lock *)bVar21.tagged_ptr;
                    if (local_40.lock != (optimistic_lock *)0x0) {
                      __assert_fail("!node_guard.active()",
                                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                                    ,0x62e,
                                    "static std::optional<bool> unodb::detail::olc_impl_helpers::remove_or_choose_subtree(INode &, std::byte, basic_art_key<Key>, olc_db<Key, Value> &, optimistic_lock::read_critical_section &, optimistic_lock::read_critical_section &, in_critical_section<olc_node_ptr> *, in_critical_section<olc_node_ptr> **, optimistic_lock::read_critical_section *, node_type *, olc_node_ptr *) [Key = std::span<const std::byte>, Value = std::span<const std::byte>, INode = unodb::detail::olc_inode_4<std::span<const std::byte>, std::span<const std::byte>>]"
                                   );
                    }
                    if (local_50.lock != (optimistic_lock *)0x0) {
                      __assert_fail("!child_guard.active()",
                                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                                    ,0x62f,
                                    "static std::optional<bool> unodb::detail::olc_impl_helpers::remove_or_choose_subtree(INode &, std::byte, basic_art_key<Key>, olc_db<Key, Value> &, optimistic_lock::read_critical_section &, optimistic_lock::read_critical_section &, in_critical_section<olc_node_ptr> *, in_critical_section<olc_node_ptr> **, optimistic_lock::read_critical_section *, node_type *, olc_node_ptr *) [Key = std::span<const std::byte>, Value = std::span<const std::byte>, INode = unodb::detail::olc_inode_4<std::span<const std::byte>, std::span<const std::byte>>]"
                                   );
                    }
                    (node_in_parent->value)._M_i.tagged_ptr = 0;
                    std::
                    unique_ptr<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::db_inode_qsbr_deleter<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                    ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::db_inode_qsbr_deleter<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                                   *)&stack0xffffffffffffff88);
                    optimistic_lock::write_guard::~write_guard(&local_50);
                    optimistic_lock::write_guard::~write_guard(&local_40);
                    optimistic_lock::write_guard::~write_guard(&node_guard_1);
                    LOCK();
                    (db_instance_00->shrinking_inode_counts)._M_elems[0].
                    super___atomic_base<unsigned_long>._M_i =
                         (db_instance_00->shrinking_inode_counts)._M_elems[0].
                         super___atomic_base<unsigned_long>._M_i + 1;
                    UNLOCK();
                    goto LAB_001d771b;
                  }
                  optimistic_lock::write_guard::~write_guard(&local_50);
                }
                optimistic_lock::write_guard::~write_guard(&local_40);
              }
              optimistic_lock::write_guard::~write_guard(&node_guard_1);
              goto LAB_001d7b2c;
            }
            plVar5 = (long *)((child_guard_1.lock)->version).version.
                             super___atomic_base<unsigned_long>._M_i;
            lVar6 = ((child_guard_1.lock)->read_lock_count).super___atomic_base<long>._M_i;
            if (plVar5[1] < 1) goto LAB_001d7b44;
            LOCK();
            plVar1 = plVar5 + 1;
            lVar3 = *plVar1;
            *plVar1 = *plVar1 + -1;
            UNLOCK();
            wVar14 = child_guard_1;
            if (lVar6 == *plVar5) {
              if (lVar3 < 1) goto LAB_001d7b63;
              uVar24 = 0;
              ((child_guard_1.lock)->version).version.super___atomic_base<unsigned_long>._M_i = 0;
              bVar15 = optimistic_lock::try_upgrade_to_write_lock
                                 (parent_critical_section->lock,
                                  (version_type)(parent_critical_section->version).version);
              local_78._M_i = 0;
              if (bVar15) {
                local_78._M_i = (__int_type_conflict)parent_critical_section->lock;
              }
              parent_critical_section->lock = (optimistic_lock *)0x0;
              if ((optimistic_lock *)local_78._M_i != (optimistic_lock *)0x0) {
                bVar15 = optimistic_lock::try_upgrade_to_write_lock
                                   ((optimistic_lock *)*child_in_parent,
                                    (version_type)child_in_parent[1]);
                uVar24 = 0;
                poVar25 = (optimistic_lock *)0x0;
                if (bVar15) {
                  poVar25 = (optimistic_lock *)*child_in_parent;
                }
                *child_in_parent =
                     (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                      *)0x0;
                node_guard_1.lock = poVar25;
                if (poVar25 != (optimistic_lock *)0x0) {
                  optimistic_lock::atomic_version_type::write_unlock_and_obsolete(&poVar25->version)
                  ;
                  pVar20 = pthread_self();
                  (poVar25->obsoleter_thread)._M_thread = pVar20;
                  node_guard_1.lock = (optimistic_lock *)0x0;
                  olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                  ::remove((olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                            *)this,(char *)((ulong)uVar12 & 0xff));
                  (node_in_parent->value)._M_i.tagged_ptr = 0;
                  uVar24 = 0x100;
                }
                optimistic_lock::write_guard::~write_guard(&node_guard_1);
              }
              optimistic_lock::write_guard::~write_guard((write_guard *)&stack0xffffffffffffff88);
              goto LAB_001d78c0;
            }
          }
          else {
            plVar5 = (long *)((child_guard_1.lock)->version).version.
                             super___atomic_base<unsigned_long>._M_i;
            lVar6 = ((child_guard_1.lock)->read_lock_count).super___atomic_base<long>._M_i;
            if (plVar5[1] < 1) goto LAB_001d7b44;
            LOCK();
            plVar1 = plVar5 + 1;
            lVar3 = *plVar1;
            *plVar1 = *plVar1 + -1;
            UNLOCK();
            wVar14 = child_guard_1;
            if (lVar6 == *plVar5) {
              if (lVar3 < 1) goto LAB_001d7b63;
              ((child_guard_1.lock)->version).version.super___atomic_base<unsigned_long>._M_i = 0;
              poVar25 = parent_critical_section->lock;
              _Var7 = (parent_critical_section->version).version;
              if ((poVar25->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_001d7b44;
              _Var8 = (poVar25->version).version.super___atomic_base<unsigned_long>._M_i;
              LOCK();
              paVar2 = &poVar25->read_lock_count;
              lVar3 = (paVar2->super___atomic_base<long>)._M_i;
              (paVar2->super___atomic_base<long>)._M_i =
                   (paVar2->super___atomic_base<long>)._M_i + -1;
              UNLOCK();
              wVar14.lock = (optimistic_lock *)parent_critical_section;
              if (_Var7 == _Var8) {
                if (lVar3 < 1) goto LAB_001d7b63;
                parent_critical_section->lock = (optimistic_lock *)0x0;
                piVar9 = *child_in_parent;
                piVar10 = child_in_parent[1];
                if ((long)piVar9[1].value._M_i.tagged_ptr < 1) goto LAB_001d7b44;
                piVar11 = (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                           *)(piVar9->value)._M_i.tagged_ptr;
                LOCK();
                piVar9 = piVar9 + 1;
                uVar23 = (piVar9->value)._M_i.tagged_ptr;
                (piVar9->value)._M_i.tagged_ptr = (piVar9->value)._M_i.tagged_ptr - 1;
                UNLOCK();
                if (piVar10 == piVar11) goto LAB_001d797b;
                if ((long)uVar23 < 1) goto LAB_001d7b63;
                *child_in_parent =
                     (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                      *)0x0;
                goto LAB_001d7b2c;
              }
            }
          }
          parent_critical_section = (read_critical_section *)wVar14.lock;
          if (lVar3 < 1) {
LAB_001d7b63:
            __assert_fail("old_value > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                          ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
          }
          goto LAB_001d7b25;
        }
        (node_in_parent->value)._M_i.tagged_ptr = (uintptr_t)(this + (ulong)uVar12 * 8 + 0x28);
        plVar5 = (long *)((child_guard_1.lock)->version).version.super___atomic_base<unsigned_long>.
                         _M_i;
        lVar6 = ((child_guard_1.lock)->read_lock_count).super___atomic_base<long>._M_i;
        if (plVar5[1] < 1) goto LAB_001d7b44;
        LOCK();
        plVar1 = plVar5 + 1;
        lVar3 = *plVar1;
        *plVar1 = *plVar1 + -1;
        UNLOCK();
        if (lVar6 == *plVar5) {
          if (lVar3 < 1) goto LAB_001d7b63;
          ((child_guard_1.lock)->version).version.super___atomic_base<unsigned_long>._M_i = 0;
LAB_001d771b:
          uVar24 = 0x100;
LAB_001d78c0:
          uVar16 = 1;
          goto LAB_001d7992;
        }
        if (lVar3 < 1) goto LAB_001d7b63;
        ((child_guard_1.lock)->version).version.super___atomic_base<unsigned_long>._M_i = 0;
      }
    }
    else {
LAB_001d7b25:
      (((optimistic_lock *)parent_critical_section)->version).version.
      super___atomic_base<unsigned_long>._M_i = 0;
    }
  }
LAB_001d7b2c:
  uVar16 = 0;
  uVar24 = 0;
LAB_001d7992:
  return (_Optional_base<bool,_true,_true>)(_Optional_base<bool,_true,_true>)(uVar24 | uVar16);
}

Assistant:

[[nodiscard]] std::optional<bool> olc_impl_helpers::remove_or_choose_subtree(
    INode& inode, std::byte key_byte, basic_art_key<Key> k,
    olc_db<Key, Value>& db_instance,
    optimistic_lock::read_critical_section& parent_critical_section,
    optimistic_lock::read_critical_section& node_critical_section,
    in_critical_section<olc_node_ptr>* node_in_parent,
    in_critical_section<olc_node_ptr>** child_in_parent,
    optimistic_lock::read_critical_section* child_critical_section,
    node_type* child_type, olc_node_ptr* child) {
  const auto [child_i, found_child]{inode.find_child(key_byte)};

  if (found_child == nullptr) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    return false;
  }

  *child = found_child->load();

  if (UNODB_DETAIL_UNLIKELY(!node_critical_section.check())) return {};

  auto& child_lock{node_ptr_lock(*child)};
  *child_critical_section = child_lock.try_read_lock();
  if (UNODB_DETAIL_UNLIKELY(child_critical_section->must_restart())) return {};

  *child_type = child->type();

  if (*child_type != node_type::LEAF) {
    *child_in_parent = found_child;
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    return true;
  }

  const auto* const leaf{child->ptr<olc_leaf_type<Key, Value>*>()};
  if (!leaf->matches(k)) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!child_critical_section->try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    return false;
  }

  const auto is_node_min_size{inode.is_min_size()};

  if (UNODB_DETAIL_LIKELY(!is_node_min_size)) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    const optimistic_lock::write_guard node_guard{
        std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    child_guard.unlock_and_obsolete();

    inode.remove(child_i, db_instance);

    *child_in_parent = nullptr;
    return true;
  }

  UNODB_DETAIL_ASSERT(is_node_min_size);

  if constexpr (std::is_same_v<INode, olc_inode_4<Key, Value>>) {
    const optimistic_lock::write_guard parent_guard{
        std::move(parent_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

    optimistic_lock::write_guard node_guard{std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    auto current_node{olc_art_policy<Key, Value>::make_db_inode_reclaimable_ptr(
        &inode, db_instance)};
    node_guard.unlock_and_obsolete();
    child_guard.unlock_and_obsolete();
    *node_in_parent = current_node->leave_last_child(child_i, db_instance);

    UNODB_DETAIL_ASSERT(!node_guard.active());
    UNODB_DETAIL_ASSERT(!child_guard.active());

    *child_in_parent = nullptr;
  } else {
    auto smaller_node{INode::smaller_derived_type::create(db_instance, inode)};

    const optimistic_lock::write_guard parent_guard{
        std::move(parent_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

    optimistic_lock::write_guard node_guard{std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    smaller_node->init(db_instance, inode, node_guard, child_i, child_guard);
    *node_in_parent = detail::olc_node_ptr{smaller_node.release(),
                                           INode::smaller_derived_type::type};

    UNODB_DETAIL_ASSERT(!node_guard.active());
    UNODB_DETAIL_ASSERT(!child_guard.active());

    *child_in_parent = nullptr;
  }

#ifdef UNODB_DETAIL_WITH_STATS
  db_instance.template account_shrinking_inode<INode::type>();
#endif  // UNODB_DETAIL_WITH_STATS

  return true;
}